

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O0

void ex_toint(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  long lVar1;
  t_float *ptVar2;
  int local_50;
  int j;
  t_float scalar;
  t_float *rp;
  t_float *lp;
  t_float *op;
  ex_ex *left;
  ex_ex *optr_local;
  ex_ex *argv_local;
  long argc_local;
  t_expr *e_local;
  
  lVar1 = argv->ex_type;
  if (lVar1 == 1) {
    if (optr->ex_type == 0xf) {
      ex_mkvector((optr->ex_cont).v_vec,(float)(int)(argv->ex_cont).v_flt,e->exp_vsize);
    }
    else {
      optr->ex_type = 1;
      optr->ex_cont = (anon_union_8_5_735de1bb_for_ex_cont)SEXT48((argv->ex_cont).v_flt);
    }
  }
  else if (lVar1 == 2) {
    if (optr->ex_type == 0xf) {
      ex_mkvector((optr->ex_cont).v_vec,(float)(int)(argv->ex_cont).v_flt,e->exp_vsize);
    }
    else {
      optr->ex_type = 2;
      (optr->ex_cont).v_flt = (float)(int)(argv->ex_cont).v_flt;
    }
  }
  else if (lVar1 - 0xeU < 2) {
    if (optr->ex_type != 0xf) {
      optr->ex_type = 0xf;
      ptVar2 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar2;
    }
    local_50 = e->exp_vsize;
    rp = (argv->ex_cont).v_vec;
    lp = (optr->ex_cont).v_vec;
    while (local_50 != 0) {
      *lp = (float)(int)*rp;
      local_50 = local_50 + -1;
      rp = rp + 1;
      lp = lp + 1;
    }
  }
  else {
    pd_error(e,"expr: FUNV_EVAL_UNARY(%d): bad left type %ld\n",0x22b,argv->ex_type);
  }
  return;
}

Assistant:

static void
ex_toint(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;

#define toint(x)        ((int)(x))
                FUNC_EVAL_UNARY(left, toint, (int), optr, 0);
        }